

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O0

void __thiscall FIX::ScreenLog::onOutgoing(ScreenLog *this,string *value)

{
  ostream *poVar1;
  int in_ECX;
  string local_90;
  string local_70;
  string local_50;
  Locker local_20;
  Locker l;
  string *value_local;
  ScreenLog *this_local;
  
  if ((this->m_outgoing & 1U) != 0) {
    l.m_mutex = (Mutex *)value;
    Locker::Locker(&local_20,(Mutex *)s_mutex);
    UtcTimeStamp::setCurrent(&this->m_time);
    poVar1 = std::operator<<((ostream *)&std::cout,"<");
    UtcTimeStampConvertor::convert_abi_cxx11_
              (&local_50,(UtcTimeStampConvertor *)&this->m_time,(UtcTimeStamp *)0x9,in_ECX);
    poVar1 = std::operator<<(poVar1,(string *)&local_50);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = std::operator<<(poVar1,(string *)&this->m_prefix);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = std::operator<<(poVar1,"outgoing>");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,"  (");
    std::__cxx11::string::string((string *)&local_90,(string *)l.m_mutex);
    replaceSOHWithPipe(&local_70,&local_90);
    poVar1 = std::operator<<(poVar1,(string *)&local_70);
    poVar1 = std::operator<<(poVar1,")");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    Locker::~Locker(&local_20);
  }
  return;
}

Assistant:

void onOutgoing(const std::string &value) override {
    if (!m_outgoing) {
      return;
    }
    Locker l(s_mutex);
    m_time.setCurrent();
    std::cout << "<" << UtcTimeStampConvertor::convert(m_time, 9) << ", " << m_prefix << ", " << "outgoing>"
              << std::endl
              << "  (" << replaceSOHWithPipe(value) << ")" << std::endl;
  }